

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_drawpixels.c
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  float *pfVar10;
  char *format;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined4 uVar14;
  float fVar15;
  undefined4 in_XMM1_Da;
  undefined4 local_a48;
  undefined4 local_a38;
  undefined8 auStack_9f8 [4];
  undefined8 local_9d8;
  ALLEGRO_KEYBOARD_STATE key_state;
  Point stars [3] [100];
  
  cVar5 = al_install_system(0x5020700,atexit);
  if (cVar5 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    lVar8 = al_create_display(0x280,0x1e0);
    if (lVar8 != 0) {
      uVar14 = al_map_rgba(0xff,100,0xff,0x80);
      auStack_9f8[2] = al_map_rgba(0xff,100,100,0xff);
      local_9d8 = al_map_rgba(100,100,0xff,0xff);
      pfVar10 = &stars[0][0].y;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        for (lVar12 = 0; lVar12 != 100; lVar12 = lVar12 + 1) {
          iVar6 = rand();
          pfVar10[lVar12 * 2 + -1] = (float)(iVar6 % 0x280);
          iVar6 = rand();
          pfVar10[lVar12 * 2] = (float)(iVar6 % 0x1e0);
        }
        pfVar10 = pfVar10 + 200;
      }
      dVar3 = (double)al_get_time();
      dVar4 = (double)al_get_time();
      iVar6 = 0;
      lVar11 = (long)(dVar3 * 1000.0);
      do {
        al_map_rgb(0,0,0);
        al_clear_to_color();
        for (lVar12 = 0; lVar12 != 100; lVar12 = lVar12 + 1) {
          al_draw_pixel(stars[0][lVar12].x,stars[0][lVar12].y,uVar14,in_XMM1_Da);
        }
        uVar9 = al_get_backbuffer(lVar8);
        al_lock_bitmap(uVar9,0,0);
        pfVar10 = &stars[1][0].y;
        for (lVar12 = 1; lVar12 != 3; lVar12 = lVar12 + 1) {
          uVar9 = auStack_9f8[lVar12 * 2];
          uVar2 = auStack_9f8[lVar12 * 2 + 1];
          for (lVar13 = 0; lVar13 != 100; lVar13 = lVar13 + 1) {
            local_a38 = (undefined4)uVar9;
            local_a48 = (undefined4)uVar2;
            al_put_pixel(local_a38,local_a48,(int)pfVar10[lVar13 * 2 + -1],(int)pfVar10[lVar13 * 2])
            ;
          }
          pfVar10 = pfVar10 + 200;
        }
        al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        al_put_pixel(0,0);
        al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        al_put_pixel(0x27f,0);
        al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        al_put_pixel(0,0x1df);
        al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        al_put_pixel(0x27f,0x1df);
        uVar9 = al_get_backbuffer(lVar8);
        al_unlock_bitmap(uVar9);
        al_flip_display();
        dVar3 = (double)al_get_time();
        pfVar10 = &stars[0][0].y;
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          fVar1 = (float)(&DAT_00102030)[lVar12];
          for (lVar13 = 0; lVar13 != 100; lVar13 = lVar13 + 1) {
            fVar15 = pfVar10[lVar13 * 2] + -fVar1 * (float)((long)(dVar3 * 1000.0) - lVar11);
            pfVar10[lVar13 * 2] = fVar15;
            if (fVar15 < 0.0) {
              iVar7 = rand();
              pfVar10[lVar13 * 2 + -1] = (float)(iVar7 % 0x280);
              pfVar10[lVar13 * 2] = 480.0;
            }
          }
          pfVar10 = pfVar10 + 200;
        }
        iVar6 = iVar6 + 1;
        al_rest(0xd2f1a9fc);
        al_get_keyboard_state(&key_state);
        cVar5 = al_key_down();
        lVar11 = (long)(dVar3 * 1000.0);
      } while (cVar5 == '\0');
      dVar3 = (double)al_get_time();
      dVar3 = dVar3 - dVar4;
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        log_printf("%d FPS\n",(ulong)(uint)(int)((double)iVar6 / dVar3));
      }
      al_destroy_display(lVar8);
      return 0;
    }
    format = "Could not create display.\n";
  }
  abort_example(format);
  iVar6 = __cxa_atexit();
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_KEYBOARD_STATE key_state;
   Point stars[3][NUM_STARS/3];
   float speeds[3] = { 0.0001f, 0.05f, 0.15f };
   ALLEGRO_COLOR colors[3];
   long start, now, elapsed, frame_count;
   int total_frames = 0;
   double program_start;
   double length;
   int layer, star;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   al_install_keyboard();
   
   display = al_create_display(WIDTH, HEIGHT);
   if (!display) {
      abort_example("Could not create display.\n");
   }

   colors[0] = al_map_rgba(255, 100, 255, 128);
   colors[1] = al_map_rgba(255, 100, 100, 255);
   colors[2] = al_map_rgba(100, 100, 255, 255);
         
   for (layer = 0; layer < 3; layer++) {
      for (star = 0; star < NUM_STARS/3; star++) {
         Point *p = &stars[layer][star];
         p->x = rand() % WIDTH;
         p->y = rand() % HEIGHT;
      }
   }


   start = al_get_time() * 1000;
   now = start;
   elapsed = 0;
   frame_count = 0;
   program_start = al_get_time();


   while (1) {
      if (frame_count < (1000/TARGET_FPS)) {
         frame_count += elapsed;
      }
      else {
         int X, Y;

         frame_count -= (1000/TARGET_FPS);
         al_clear_to_color(al_map_rgb(0, 0, 0));
         for (star = 0; star < NUM_STARS/3; star++) {
            Point *p = &stars[0][star];
            al_draw_pixel(p->x, p->y, colors[0]);
         }
         al_lock_bitmap(al_get_backbuffer(display), ALLEGRO_PIXEL_FORMAT_ANY, 0);

         for (layer = 1; layer < 3; layer++) {
            for (star = 0; star < NUM_STARS/3; star++) {
               Point *p = &stars[layer][star];
               // put_pixel ignores blending
               al_put_pixel(p->x, p->y, colors[layer]);
            }
         }

         /* Check that dots appear at the window extremes. */
         X = WIDTH - 1;
         Y = HEIGHT - 1;
         al_put_pixel(0, 0, al_map_rgb_f(1, 1, 1));
         al_put_pixel(X, 0, al_map_rgb_f(1, 1, 1));
         al_put_pixel(0, Y, al_map_rgb_f(1, 1, 1));
         al_put_pixel(X, Y, al_map_rgb_f(1, 1, 1));

         al_unlock_bitmap(al_get_backbuffer(display));
         al_flip_display();
         total_frames++;
      }

      now = al_get_time() * 1000;
      elapsed = now - start;
      start = now;

      for (layer = 0; layer < 3; layer++) {
         for (star = 0; star < NUM_STARS/3; star++) {
            Point *p = &stars[layer][star];
            p->y -= speeds[layer] * elapsed;
            if (p->y < 0) {
               p->x = rand() % WIDTH;
               p->y = HEIGHT;
            }
         }
      }

      al_rest(0.001);

      al_get_keyboard_state(&key_state);
      if (al_key_down(&key_state, ALLEGRO_KEY_ESCAPE))
         break;
   }

   length = al_get_time() - program_start;

   if (length != 0) {
      log_printf("%d FPS\n", (int)(total_frames / length));
   }

   al_destroy_display(display);

   close_log(true);

   return 0;
}